

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  ostream *poVar1;
  cmAlphaNum *this;
  string_view str;
  string val;
  cmAlphaNum local_a8;
  string local_78;
  cmAlphaNum local_58;
  
  if (name->_M_string_length == 0) {
    local_a8.View_._M_len = 0x36;
    local_a8.View_._M_str = "No name given for WriteVariable! called with comment: ";
    local_58.View_._M_str = (comment->_M_dataplus)._M_p;
    local_58.View_._M_len = comment->_M_string_length;
    cmStrCat<>(&local_78,&local_a8,&local_58);
    cmSystemTools::Error(&local_78);
    this = (cmAlphaNum *)&local_78;
  }
  else {
    str._M_str = (value->_M_dataplus)._M_p;
    str._M_len = value->_M_string_length;
    cmTrimWhitespace_abi_cxx11_((string *)&local_a8,str);
    this = &local_a8;
    if (local_a8.View_._M_str != (char *)0x0) {
      WriteComment(os,comment);
      Indent(os,indent);
      poVar1 = std::operator<<(os,(string *)name);
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = std::operator<<(poVar1,(string *)&local_a8);
      std::operator<<(poVar1,"\n");
      this = &local_a8;
    }
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if (name.empty()) {
    cmSystemTools::Error(cmStrCat("No name given for WriteVariable! called "
                                  "with comment: ",
                                  comment));
    return;
  }

  // Do not add a variable if the value is empty.
  std::string val = cmTrimWhitespace(value);
  if (val.empty()) {
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}